

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMagCal.cpp
# Opt level: O2

bool __thiscall RTIMUMagCal::magCalSaveRaw(RTIMUMagCal *this,char *ellipsoidFitPath)

{
  size_t sVar1;
  char *__s;
  FILE *__stream;
  bool bVar2;
  RTVector3 RVar3;
  
  bVar2 = true;
  if (ellipsoidFitPath != (char *)0x0) {
    sVar1 = strlen(ellipsoidFitPath);
    __s = (char *)malloc(sVar1 + 0xc);
    sprintf(__s,"%s/%s",ellipsoidFitPath,"magRaw.dta");
    __stream = fopen(__s,"w");
    if (__stream == (FILE *)0x0) {
      fwrite("Failed to open ellipsoid fit raw data file\n",0x2b,1,_stderr);
      bVar2 = false;
    }
    else {
      while (0 < this->m_magCalCount) {
        RVar3 = removeMagCalData(this);
        fprintf(__stream,"%f %f %f\n",(double)RVar3.m_data[0],SUB84((double)RVar3.m_data[1],0),
                (double)RVar3.m_data[2]);
      }
      fclose(__stream);
    }
  }
  return bVar2;
}

Assistant:

bool RTIMUMagCal::magCalSaveRaw(const char *ellipsoidFitPath)
{
    FILE *file;
    char *rawFile;

    if (ellipsoidFitPath != NULL) {
        // need to deal with ellipsoid fit processing
        rawFile = (char *)malloc(strlen(RTIMUCALDEFS_MAG_RAW_FILE) + strlen(ellipsoidFitPath) + 2);
        sprintf(rawFile, "%s/%s", ellipsoidFitPath, RTIMUCALDEFS_MAG_RAW_FILE);
        if ((file = fopen(rawFile, "w")) == NULL) {
            HAL_ERROR("Failed to open ellipsoid fit raw data file\n");
            return false;
        }
        while (m_magCalCount > 0) {
            RTVector3 sample = removeMagCalData();
            fprintf(file, "%f %f %f\n", sample.x(), sample.y(), sample.z());
        }
        fclose(file);
    }
    return true;
}